

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O3

void __thiscall
Gudhi::ripser::
Persistent_cohomology<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>_>
::assemble_columns_to_reduce
          (Persistent_cohomology<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>_>
           *this,vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_simplex_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_simplex_t>_>
                 *simplices,
          vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_simplex_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_simplex_t>_>
          *columns_to_reduce,entry_hash_map *pivot_column_index,dimension_t dim)

{
  iterator __position;
  __normal_iterator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_simplex_t_*,_std::vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_simplex_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_simplex_t>_>_>
  __first;
  __normal_iterator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_simplex_t_*,_std::vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_simplex_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_simplex_t>_>_>
  __last;
  long lVar1;
  pointer pdVar2;
  pointer pdVar3;
  diameter_entry_t _simplex;
  diameter_entry_t simplex;
  diameter_entry_t simplex_00;
  node_pointer ppVar4;
  ulong uVar5;
  pointer pdVar6;
  optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>
  cofacet;
  pointer local_158;
  iterator iStack_150;
  pointer local_148;
  int local_134;
  vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,unsigned__int128,float>>,Gudhi::ripser::TParams<false,unsigned__int128,float>>::diameter_simplex_t,std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,unsigned__int128,float>>,Gudhi::ripser::TParams<false,unsigned__int128,float>>::diameter_simplex_t>>
  *local_130;
  vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_simplex_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_simplex_t>_>
  *local_128;
  pointer local_120;
  pointer local_118;
  table<boost::unordered::detail::map<std::allocator<std::pair<const_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::entry_plain_t,_unsigned_long>_>,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::entry_plain_t,_unsigned_long,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::Entry_hash,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::Equal_index>_>
  *local_110;
  undefined1 local_108 [32];
  bool local_e8;
  diameter_simplex_t local_d8;
  char local_b8;
  value_t local_a8;
  undefined4 uStack_a4;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>
  local_68;
  
  pdVar6 = (columns_to_reduce->
           super__Vector_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_simplex_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_simplex_t>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((columns_to_reduce->
      super__Vector_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_simplex_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_simplex_t>_>
      )._M_impl.super__Vector_impl_data._M_finish != pdVar6) {
    (columns_to_reduce->
    super__Vector_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_simplex_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_simplex_t>_>
    )._M_impl.super__Vector_impl_data._M_finish = pdVar6;
  }
  local_158 = (pointer)0x0;
  iStack_150._M_current = (pointer)0x0;
  local_148 = (pointer)0x0;
  pdVar6 = (simplices->
           super__Vector_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_simplex_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_simplex_t>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_120 = (simplices->
              super__Vector_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_simplex_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_simplex_t>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  local_130 = (vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,unsigned__int128,float>>,Gudhi::ripser::TParams<false,unsigned__int128,float>>::diameter_simplex_t,std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,unsigned__int128,float>>,Gudhi::ripser::TParams<false,unsigned__int128,float>>::diameter_simplex_t>>
               *)columns_to_reduce;
  local_128 = simplices;
  local_110 = &pivot_column_index->table_;
  if (pdVar6 != local_120) {
    local_134 = (int)(char)(dim + -1);
    do {
      local_a8 = pdVar6->diameter;
      uStack_90 = *(undefined8 *)((long)&pdVar6->index + 8);
      local_98 = (undefined8)pdVar6->index;
      _simplex.
      super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::entry_plain_t>
      ._4_4_ = uStack_a4;
      _simplex.
      super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::entry_plain_t>
      .first = local_a8;
      _simplex.
      super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::entry_plain_t>
      ._8_8_ = uStack_a0;
      _simplex.
      super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::entry_plain_t>
      .second.index._0_8_ = local_98;
      _simplex.
      super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::entry_plain_t>
      .second.index._8_8_ = uStack_90;
      local_118 = pdVar6;
      Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>
      ::
      Simplex_coboundary_enumerator_<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Tag_sparse>
      ::set_simplex(&this->cofacets2,_simplex,(dimension_t)local_134);
      while( true ) {
        Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>
        ::
        Simplex_coboundary_enumerator_<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Tag_sparse>
        ::next_raw((optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>
                    *)local_108,&this->cofacets2,false);
        if (local_e8 == false) break;
        if (dim < this->dim_max) {
          local_d8.diameter = (value_t)local_108._0_4_;
          local_d8.index._0_8_ = local_108._16_8_;
          local_d8.index._8_8_ = local_108._24_8_;
          if (iStack_150._M_current == local_148) {
            std::
            vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,unsigned__int128,float>>,Gudhi::ripser::TParams<false,unsigned__int128,float>>::diameter_simplex_t,std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,unsigned__int128,float>>,Gudhi::ripser::TParams<false,unsigned__int128,float>>::diameter_simplex_t>>
            ::
            _M_realloc_insert<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,unsigned__int128,float>>,Gudhi::ripser::TParams<false,unsigned__int128,float>>::diameter_simplex_t>
                      ((vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,unsigned__int128,float>>,Gudhi::ripser::TParams<false,unsigned__int128,float>>::diameter_simplex_t,std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,unsigned__int128,float>>,Gudhi::ripser::TParams<false,unsigned__int128,float>>::diameter_simplex_t>>
                        *)&local_158,iStack_150,&local_d8);
          }
          else {
            *(undefined8 *)&(iStack_150._M_current)->index = local_108._16_8_;
            *(undefined8 *)((long)&(iStack_150._M_current)->index + 8) = local_108._24_8_;
            *(ulong *)iStack_150._M_current = CONCAT44(local_d8._4_4_,local_108._0_4_);
            *(undefined8 *)&(iStack_150._M_current)->field_0x8 = local_d8._8_8_;
            iStack_150._M_current = iStack_150._M_current + 1;
          }
        }
        local_88 = CONCAT44(local_108._4_4_,local_108._0_4_);
        local_78 = local_108._16_8_;
        uStack_70 = local_108._24_8_;
        uStack_80 = local_108._8_8_;
        simplex.
        super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::entry_plain_t>
        ._4_4_ = local_108._4_4_;
        simplex.
        super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::entry_plain_t>
        .first = (float)local_108._0_4_;
        simplex.
        super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::entry_plain_t>
        ._8_8_ = local_108._8_8_;
        simplex.
        super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::entry_plain_t>
        .second.index._0_8_ = local_108._16_8_;
        simplex.
        super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::entry_plain_t>
        .second.index._8_8_ = local_108._24_8_;
        get_zero_apparent_cofacet
                  ((optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>
                    *)&local_d8,this,simplex,dim);
        if (local_b8 != '\x01') {
          simplex_00.
          super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::entry_plain_t>
          ._8_8_ = uStack_80;
          simplex_00.
          super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::entry_plain_t>
          ._0_8_ = local_88;
          simplex_00.
          super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::entry_plain_t>
          .second.index._0_8_ = local_78;
          simplex_00.
          super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::entry_plain_t>
          .second.index._8_8_ = uStack_70;
          get_zero_apparent_facet(&local_68,this,simplex_00,dim);
          if (local_68.
              super__Optional_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t,_true,_true>
              ._M_payload.
              super__Optional_payload_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>
              ._M_engaged == false) {
            ppVar4 = boost::unordered::detail::
                     table<boost::unordered::detail::map<std::allocator<std::pair<const_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::entry_plain_t,_unsigned_long>_>,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::entry_plain_t,_unsigned_long,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::Entry_hash,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::Equal_index>_>
                     ::find_node(local_110,(const_key_type *)(local_108 + 0x10));
            if (ppVar4 == (node_pointer)0x0) {
              local_d8.diameter = (value_t)local_108._0_4_;
              local_d8.index._0_8_ = local_108._16_8_;
              local_d8.index._8_8_ = local_108._24_8_;
              __position._M_current = *(diameter_simplex_t **)(local_130 + 8);
              if (__position._M_current == *(diameter_simplex_t **)(local_130 + 0x10)) {
                std::
                vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,unsigned__int128,float>>,Gudhi::ripser::TParams<false,unsigned__int128,float>>::diameter_simplex_t,std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,unsigned__int128,float>>,Gudhi::ripser::TParams<false,unsigned__int128,float>>::diameter_simplex_t>>
                ::
                _M_realloc_insert<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,unsigned__int128,float>>,Gudhi::ripser::TParams<false,unsigned__int128,float>>::diameter_simplex_t>
                          (local_130,__position,&local_d8);
              }
              else {
                *(undefined8 *)&(__position._M_current)->index = local_108._16_8_;
                *(undefined8 *)((long)&(__position._M_current)->index + 8) = local_108._24_8_;
                *(ulong *)__position._M_current = CONCAT44(local_d8._4_4_,local_108._0_4_);
                *(undefined8 *)&(__position._M_current)->field_0x8 = local_d8._8_8_;
                *(long *)(local_130 + 8) = *(long *)(local_130 + 8) + 0x20;
              }
            }
          }
        }
      }
      pdVar6 = local_118 + 1;
    } while (pdVar6 != local_120);
  }
  if (dim < this->dim_max) {
    pdVar6 = (local_128->
             super__Vector_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_simplex_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_simplex_t>_>
             )._M_impl.super__Vector_impl_data._M_end_of_storage;
    (local_128->
    super__Vector_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_simplex_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_simplex_t>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = local_148;
    pdVar2 = (local_128->
             super__Vector_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_simplex_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_simplex_t>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pdVar3 = (local_128->
             super__Vector_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_simplex_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_simplex_t>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    (local_128->
    super__Vector_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_simplex_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_simplex_t>_>
    )._M_impl.super__Vector_impl_data._M_start = local_158;
    (local_128->
    super__Vector_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_simplex_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_simplex_t>_>
    )._M_impl.super__Vector_impl_data._M_finish = iStack_150._M_current;
    local_158 = pdVar2;
    iStack_150._M_current = pdVar3;
    local_148 = pdVar6;
  }
  __first._M_current = *(diameter_simplex_t **)local_130;
  __last._M_current = *(diameter_simplex_t **)(local_130 + 8);
  if (__first._M_current != __last._M_current) {
    uVar5 = (long)__last._M_current - (long)__first._M_current >> 5;
    lVar1 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,unsigned__int128,float>>,Gudhi::ripser::TParams<false,unsigned__int128,float>>::diameter_simplex_t*,std::vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,unsigned__int128,float>>,Gudhi::ripser::TParams<false,unsigned__int128,float>>::diameter_simplex_t,std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,unsigned__int128,float>>,Gudhi::ripser::TParams<false,unsigned__int128,float>>::diameter_simplex_t>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,unsigned__int128,float>>,Gudhi::ripser::TParams<false,unsigned__int128,float>>::Greater_diameter_or_smaller_index<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,unsigned__int128,float>>,Gudhi::ripser::TParams<false,unsigned__int128,float>>::diameter_simplex_t>>>
              (__first,__last,(ulong)(((uint)lVar1 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::Greater_diameter_or_smaller_index<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_simplex_t>_>
                )this);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,unsigned__int128,float>>,Gudhi::ripser::TParams<false,unsigned__int128,float>>::diameter_simplex_t*,std::vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,unsigned__int128,float>>,Gudhi::ripser::TParams<false,unsigned__int128,float>>::diameter_simplex_t,std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,unsigned__int128,float>>,Gudhi::ripser::TParams<false,unsigned__int128,float>>::diameter_simplex_t>>>,__gnu_cxx::__ops::_Iter_comp_iter<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,unsigned__int128,float>>,Gudhi::ripser::TParams<false,unsigned__int128,float>>::Greater_diameter_or_smaller_index<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,unsigned__int128,float>>,Gudhi::ripser::TParams<false,unsigned__int128,float>>::diameter_simplex_t>>>
              (__first,__last,
               (_Iter_comp_iter<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::Greater_diameter_or_smaller_index<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_simplex_t>_>
                )this);
  }
  if (local_158 != (pointer)0x0) {
    operator_delete(local_158,(long)local_148 - (long)local_158);
  }
  return;
}

Assistant:

void assemble_columns_to_reduce(std::vector<diameter_simplex_t>& simplices,
      std::vector<diameter_simplex_t>& columns_to_reduce,
      entry_hash_map& pivot_column_index, dimension_t dim) {

#ifdef GUDHI_INDICATE_PROGRESS
    std::cerr << clear_line << "assembling columns" << std::flush;
    std::chrono::steady_clock::time_point next = std::chrono::steady_clock::now() + time_step;
#endif

    columns_to_reduce.clear();
    std::vector<diameter_simplex_t> next_simplices;

    for (diameter_simplex_t& simplex : simplices) {
      cofacets2.set_simplex(filt.make_diameter_entry(simplex, 1), dim - 1);

      while(true) {
        std::optional<diameter_entry_t> cofacet = cofacets2.next(false);
        if (!cofacet) break;
#ifdef GUDHI_INDICATE_PROGRESS
        if (std::chrono::steady_clock::now() > next) {
          std::cerr << clear_line << "assembling " << next_simplices.size()
            << " columns (processing " << std::distance(&simplices[0], &simplex)
            << "/" << simplices.size() << " simplices)" << std::flush;
          next = std::chrono::steady_clock::now() + time_step;
        }
#endif
        if (dim < dim_max) next_simplices.push_back({get_diameter(*cofacet), filt.get_index(*cofacet)});
        // Wouldn't it be cheaper in the reverse order? Seems negligible
        if (!is_in_zero_apparent_pair(*cofacet, dim) &&
            (pivot_column_index.find(get_entry(*cofacet)) == pivot_column_index.end()))
          columns_to_reduce.push_back({get_diameter(*cofacet), filt.get_index(*cofacet)});
      }
    }

    if (dim < dim_max) simplices.swap(next_simplices);

#ifdef GUDHI_INDICATE_PROGRESS
    std::cerr << clear_line << "sorting " << columns_to_reduce.size() << " columns"
      << std::flush;
#endif

    std::sort(columns_to_reduce.begin(), columns_to_reduce.end(),
        Greater_diameter_or_smaller_index<diameter_simplex_t>(filt));
#ifdef GUDHI_INDICATE_PROGRESS
    std::cerr << clear_line << std::flush;
#endif
  }